

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

result<unsigned_long> * __thiscall
sockpp::stream_socket::read_n
          (result<unsigned_long> *__return_storage_ptr__,stream_socket *this,void *buf,size_t n)

{
  result<unsigned_long> *prVar1;
  bool bVar2;
  error_category *peVar3;
  unsigned_long uVar4;
  result<unsigned_long> res;
  errc local_54;
  result<unsigned_long> *local_50;
  result<unsigned_long> local_48;
  
  local_50 = __return_storage_ptr__;
  if (n == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      (*(this->super_socket)._vptr_socket[6])(&local_48,this,(long)buf + uVar4,n - uVar4);
      if (local_48.err_._M_value != 0) {
        local_54 = interrupted;
        bVar2 = operator!=(&local_48,&local_54);
        if (bVar2) {
          local_50->val_ = 0;
          *(ulong *)&local_50->err_ = CONCAT44(local_48.err_._4_4_,local_48.err_._M_value);
          (local_50->err_)._M_cat = local_48.err_._M_cat;
          return local_50;
        }
      }
      uVar4 = uVar4 + local_48.val_;
    } while (uVar4 < n);
  }
  prVar1 = local_50;
  local_50->val_ = uVar4;
  (local_50->err_)._M_value = 0;
  peVar3 = (error_category *)std::_V2::system_category();
  (prVar1->err_)._M_cat = peVar3;
  return prVar1;
}

Assistant:

result<size_t> stream_socket::read_n(void* buf, size_t n) {
    uint8_t* b = reinterpret_cast<uint8_t*>(buf);
    size_t nx = 0;

    while (nx < n) {
        auto res = read(b + nx, n - nx);
        if (!res && res != errc::interrupted)
            return res.error();

        nx += size_t(res.value());
    }

    return nx;
}